

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Opnd * __thiscall
Lowerer::GenerateArgOutForStackArgs(Lowerer *this,Instr *callInstr,Instr *stackArgsInstr)

{
  LowererMDArch *this_00;
  Func *pFVar1;
  Loop *pLVar2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  byte bVar7;
  ValueType VVar8;
  undefined4 *puVar9;
  Opnd *pOVar10;
  RegOpnd *pRVar11;
  Instr *pIVar12;
  RegOpnd *pRVar13;
  LabelInstr *branchTarget;
  IntConstOpnd *pIVar14;
  BranchInstr *pBVar15;
  LabelInstr *branchTarget_00;
  LabelInstr *branchTarget_01;
  Instr *pIVar16;
  IndirOpnd *pIVar17;
  RegOpnd *pRVar18;
  Instr *stackArgsInstr_00;
  undefined1 local_e0 [8];
  AutoReuseOpnd autoReuseLdLenDstOpnd;
  AutoReuseOpnd autoReuseldElemDstOpnd;
  AutoReuseOpnd autoReuseldElemDstOpnd3;
  AutoReuseOpnd autoReuseldElemDstOpnd2;
  
  if (stackArgsInstr->m_opcode != ArgOut_A_FromStackArgs) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5586,"(stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs)",
                       "stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  if (callInstr->m_opcode != CallIDynamic) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5587,"(callInstr->m_opcode == Js::OpCode::CallIDynamic)",
                       "callInstr->m_opcode == Js::OpCode::CallIDynamic");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  pRVar18 = (RegOpnd *)callInstr->m_src1;
  OVar6 = IR::Opnd::GetKind((Opnd *)pRVar18);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  this_00 = &(this->m_lowererMD).lowererMDArch;
  LowererMDArch::GenerateFunctionObjectTest(this_00,callInstr,pRVar18,false,(LabelInstr *)0x0);
  bVar5 = Func::IsInlinee(callInstr->m_func);
  if (bVar5) {
    pOVar10 = GenerateArgOutForInlineeStackArgs(this,callInstr,stackArgsInstr_00);
    return pOVar10;
  }
  pFVar1 = callInstr->m_func;
  pRVar18 = (RegOpnd *)stackArgsInstr->m_src1;
  OVar6 = IR::Opnd::GetKind((Opnd *)pRVar18);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  pRVar11 = IR::RegOpnd::New(TyInt64,pFVar1);
  local_e0 = (undefined1  [8])0x0;
  IR::AutoReuseOpnd::Initialize((AutoReuseOpnd *)local_e0,&pRVar11->super_Opnd,pFVar1,true);
  pIVar12 = IR::Instr::New(LdLen_A,&pRVar11->super_Opnd,(Opnd *)pRVar18,pFVar1);
  VVar8 = ValueType::GetTaggedInt();
  IR::Opnd::SetValueType(&pRVar11->super_Opnd,VVar8);
  IR::Instr::InsertBefore(callInstr,pIVar12);
  GenerateFastRealStackArgumentsLdLen(this,pIVar12);
  pRVar13 = IR::RegOpnd::New(TyInt64,pFVar1);
  pIVar12 = IR::Instr::New(MOV,&pRVar13->super_Opnd,&pRVar11->super_Opnd,pFVar1);
  pOVar10 = pIVar12->m_dst;
  VVar8 = ValueType::GetTaggedInt();
  IR::Opnd::SetValueType(pOVar10,VVar8);
  IR::Instr::InsertBefore(callInstr,pIVar12);
  branchTarget = IR::LabelInstr::New(Label,pFVar1,false);
  pIVar14 = IR::IntConstOpnd::New(0,TyInt8,pFVar1,false);
  pBVar15 = IR::BranchInstr::New
                      (BrEq_I4,branchTarget,&pRVar11->super_Opnd,&pIVar14->super_Opnd,pFVar1);
  IR::Instr::InsertBefore(callInstr,&pBVar15->super_Instr);
  LowererMD::EmitInt4Instr(&pBVar15->super_Instr);
  branchTarget_00 = InsertLoopTopLabel(this,callInstr);
  if ((branchTarget_00->field_0x78 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  pLVar2 = branchTarget_00->m_loop;
  branchTarget_01 = IR::LabelInstr::New(Label,pFVar1,false);
  pIVar14 = IR::IntConstOpnd::New(1,TyInt8,pFVar1,false);
  pBVar15 = IR::BranchInstr::New
                      (BrLe_I4,branchTarget_01,&pRVar11->super_Opnd,&pIVar14->super_Opnd,pFVar1);
  IR::Instr::InsertBefore(callInstr,&pBVar15->super_Instr);
  LowererMD::EmitInt4Instr(&pBVar15->super_Instr);
  pIVar14 = IR::IntConstOpnd::New(1,TyInt64,pFVar1,false);
  pIVar16 = IR::Instr::New(Sub_I4,&pRVar11->super_Opnd,&pRVar11->super_Opnd,&pIVar14->super_Opnd,
                           pFVar1);
  IR::Instr::InsertBefore(callInstr,pIVar16);
  LowererMD::EmitInt4Instr(pIVar16);
  pIVar17 = IR::IndirOpnd::New(pRVar18,pRVar11,TyInt64,pFVar1);
  pRVar13 = IR::RegOpnd::New(TyInt64,pFVar1);
  autoReuseLdLenDstOpnd.autoDelete = false;
  autoReuseLdLenDstOpnd.wasInUse = false;
  autoReuseLdLenDstOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseLdLenDstOpnd.autoDelete,&pRVar13->super_Opnd,pFVar1,true);
  pIVar16 = IR::Instr::New(LdElemI_A,&pRVar13->super_Opnd,&pIVar17->super_Opnd,pFVar1);
  IR::Instr::InsertBefore(callInstr,pIVar16);
  GenerateFastStackArgumentsLdElemI(this,pIVar16);
  pIVar16 = IR::Instr::New(ArgOut_A_Dynamic,pFVar1);
  if (pIVar16->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  pFVar3 = pIVar16->m_func;
  if ((pRVar13->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  bVar7 = (pRVar13->super_Opnd).field_0xb;
  if ((bVar7 & 2) != 0) {
    pRVar13 = (RegOpnd *)IR::Opnd::Copy(&pRVar13->super_Opnd,pFVar3);
    bVar7 = (pRVar13->super_Opnd).field_0xb;
  }
  (pRVar13->super_Opnd).field_0xb = bVar7 | 2;
  pIVar16->m_src1 = &pRVar13->super_Opnd;
  if (pIVar16->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  pFVar3 = pIVar16->m_func;
  if ((pRVar11->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  bVar7 = (pRVar11->super_Opnd).field_0xb;
  pRVar13 = pRVar11;
  if ((bVar7 & 2) != 0) {
    pRVar13 = (RegOpnd *)IR::Opnd::Copy(&pRVar11->super_Opnd,pFVar3);
    bVar7 = (pRVar13->super_Opnd).field_0xb;
  }
  (pRVar13->super_Opnd).field_0xb = bVar7 | 2;
  pIVar16->m_src2 = &pRVar13->super_Opnd;
  IR::Instr::InsertBefore(callInstr,pIVar16);
  LowererMDArch::LoadDynamicArgumentUsingLength(this_00,pIVar16);
  pBVar15 = IR::BranchInstr::New(JMP,branchTarget_00,pFVar1);
  IR::Instr::InsertBefore(callInstr,&pBVar15->super_Instr);
  IR::Instr::InsertBefore(callInstr,&branchTarget_01->super_Instr);
  BVSparse<Memory::JitArenaAllocator>::Set
            ((pLVar2->regAlloc).liveOnBackEdgeSyms,(pRVar11->m_sym->super_Sym).m_id);
  pRVar11 = IR::RegOpnd::New(TyInt32,pFVar1);
  VVar8 = ValueType::GetTaggedInt();
  IR::Opnd::SetValueType(&pRVar11->super_Opnd,VVar8);
  autoReuseldElemDstOpnd.autoDelete = false;
  autoReuseldElemDstOpnd.wasInUse = false;
  autoReuseldElemDstOpnd._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseldElemDstOpnd.autoDelete,&pRVar11->super_Opnd,pFVar1,true);
  pIVar14 = IR::IntConstOpnd::New(0,TyInt8,pFVar1,true);
  InsertMove(&pRVar11->super_Opnd,&pIVar14->super_Opnd,callInstr,true);
  pIVar17 = IR::IndirOpnd::New(pRVar18,pRVar11,TyInt64,pFVar1);
  pRVar18 = IR::RegOpnd::New(TyInt64,pFVar1);
  autoReuseldElemDstOpnd3.autoDelete = false;
  autoReuseldElemDstOpnd3.wasInUse = false;
  autoReuseldElemDstOpnd3._18_6_ = 0;
  IR::AutoReuseOpnd::Initialize
            ((AutoReuseOpnd *)&autoReuseldElemDstOpnd3.autoDelete,&pRVar18->super_Opnd,pFVar1,true);
  pIVar16 = IR::Instr::New(LdElemI_A,&pRVar18->super_Opnd,&pIVar17->super_Opnd,pFVar1);
  IR::Instr::InsertBefore(callInstr,pIVar16);
  GenerateFastStackArgumentsLdElemI(this,pIVar16);
  pIVar16 = IR::Instr::New(ArgOut_A_Dynamic,pFVar1);
  if (pIVar16->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  pFVar1 = pIVar16->m_func;
  if ((pRVar18->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_005ec832;
    *puVar9 = 0;
  }
  bVar7 = (pRVar18->super_Opnd).field_0xb;
  if ((bVar7 & 2) != 0) {
    pRVar18 = (RegOpnd *)IR::Opnd::Copy(&pRVar18->super_Opnd,pFVar1);
    bVar7 = (pRVar18->super_Opnd).field_0xb;
  }
  (pRVar18->super_Opnd).field_0xb = bVar7 | 2;
  pIVar16->m_src1 = &pRVar18->super_Opnd;
  IR::Instr::InsertBefore(callInstr,pIVar16);
  LowererMDArch::LoadDynamicArgument(this_00,pIVar16,4);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseldElemDstOpnd3.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseldElemDstOpnd.autoDelete);
  IR::Instr::InsertBefore(callInstr,&branchTarget->super_Instr);
  pOVar10 = pIVar12->m_dst;
  OVar6 = IR::Opnd::GetKind(pOVar10);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) {
LAB_005ec832:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseLdLenDstOpnd.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_e0);
  return pOVar10;
}

Assistant:

IR::Opnd*
Lowerer::GenerateArgOutForStackArgs(IR::Instr* callInstr, IR::Instr* stackArgsInstr)
{

// For architectures were we only pass 4 parameters in registers, the
// generated code looks something like this:
//    s25.var       =  LdLen_A          s4.var
//    s26.var       =  Ld_A             s25.var
//                    BrEq_I4          $L3, s25.var,0                    // If we have no further arguments to pass, don't pass them
//    $L2:
//                    BrEq_I4          $L4, s25.var,1                    // Loop through the rest of the arguments, putting them on the stack
//    s25.var       = SUB_I4            s25.var, 0x1
//    s10.var       = LdElemI_A         [s4.var+s25.var].var
//                    ArgOut_A_Dynamic  s10.var, s25.var
//                    Br $L2
//    $L4:
//    s25.var       = LdImm             0                                // set s25 to 0, since it'll be 1 on the way into this block
//    s10.var       = LdElemI_A         [s4.var + 0 * MachReg].var // The last one has to be put into argslot 4, since this is likely a register, not a stack location.
//                    ArgOut_A_Dynamic  s10.var, 4
//    $L3:
//
// Generalizing this for more register-passed parameters gives us code
// something like this:
//    s25.var       =  LdLen_A          s4.var
//    s26.var       =  Ld_A             s25.var
//                    BrLe_I4          $L3, s25.var,0                    // If we have no further arguments to pass, don't pass them
//    $L2:
//                    BrLe_I4          $L4, s25.var,INT_REG_COUNT-3      // Loop through the rest of the arguments up to the number passed in registers, putting them on the stack
//    s25.var       = SUB_I4            s25.var, 0x1
//    s10.var       = LdElemI_A         [s4.var+s25.var].var
//                    ArgOut_A_Dynamic  s10.var, s25.var
//                    Br $L2
//    $L4:
//    foreach of the remaining ones, N going down from (the number we can pass in regs -1) to 1 (0 omitted as we know that it'll be at least one register argument):
//                    BrEq_I4          $L__N, s25.var, N
//    end foreach
//    foreach of the remaining ones, N going down from (the number we can pass in regs -1) to 0:
//    $L__N:
//    s10.var       = LdElemI_A         [s4.var + N * MachReg].var // The last one has to be put into argslot 4, since this is likely a register, not a stack location.
//                    ArgOut_A_Dynamic  s10.var, N+3
//    end foreach
//    $L3:


#if defined(_M_IX86)
    // We get a compilation error on x86 due to assigning a negative to a uint
    // TODO: don't even define this function on x86 - we Assert(false) anyway there.
    // Alternatively, don't define when INT_ARG_REG_COUNT - 4 < 0
    AssertOrFailFast(false);
    return nullptr;
#else

    Assert(stackArgsInstr->m_opcode == Js::OpCode::ArgOut_A_FromStackArgs);
    Assert(callInstr->m_opcode == Js::OpCode::CallIDynamic);

    this->m_lowererMD.GenerateFunctionObjectTest(callInstr, callInstr->GetSrc1()->AsRegOpnd(), false);

    if (callInstr->m_func->IsInlinee())
    {
        return this->GenerateArgOutForInlineeStackArgs(callInstr, stackArgsInstr);
    }
    Func *func = callInstr->m_func;
    IR::RegOpnd* stackArgs = stackArgsInstr->GetSrc1()->AsRegOpnd();

    IR::RegOpnd* ldLenDstOpnd = IR::RegOpnd::New(TyMachReg, func);
    const IR::AutoReuseOpnd autoReuseLdLenDstOpnd(ldLenDstOpnd, func);
    IR::Instr* ldLen = IR::Instr::New(Js::OpCode::LdLen_A, ldLenDstOpnd ,stackArgs, func);
    ldLenDstOpnd->SetValueType(ValueType::GetTaggedInt()); /*LdLen_A works only on stack arguments*/
    callInstr->InsertBefore(ldLen);
    GenerateFastRealStackArgumentsLdLen(ldLen);

    IR::Instr* saveLenInstr = IR::Instr::New(Js::OpCode::MOV, IR::RegOpnd::New(TyMachReg, func), ldLenDstOpnd, func);
    saveLenInstr->GetDst()->SetValueType(ValueType::GetTaggedInt());
    callInstr->InsertBefore(saveLenInstr);

    IR::LabelInstr* doneArgs = IR::LabelInstr::New(Js::OpCode::Label, func);
    IR::Instr* branchDoneArgs = IR::BranchInstr::New(Js::OpCode::BrEq_I4, doneArgs, ldLenDstOpnd, IR::IntConstOpnd::New(0, TyInt8, func),func);
    callInstr->InsertBefore(branchDoneArgs);
    this->m_lowererMD.EmitInt4Instr(branchDoneArgs);

    IR::LabelInstr* startLoop = InsertLoopTopLabel(callInstr);
    Loop * loop = startLoop->GetLoop();
    IR::LabelInstr* endLoop = IR::LabelInstr::New(Js::OpCode::Label, func);

    IR::Instr* branchOutOfLoop = IR::BranchInstr::New(Js::OpCode::BrLe_I4, endLoop, ldLenDstOpnd, IR::IntConstOpnd::New(INT_ARG_REG_COUNT - 3, TyInt8, func),func);
    callInstr->InsertBefore(branchOutOfLoop);
    this->m_lowererMD.EmitInt4Instr(branchOutOfLoop);

    IR::Instr* subInstr = IR::Instr::New(Js::OpCode::Sub_I4, ldLenDstOpnd, ldLenDstOpnd, IR::IntConstOpnd::New(1, TyMachReg, func),func);
    callInstr->InsertBefore(subInstr);
    this->m_lowererMD.EmitInt4Instr(subInstr);

    IR::IndirOpnd *nthArgument = IR::IndirOpnd::New(stackArgs, ldLenDstOpnd, TyMachReg, func);
    IR::RegOpnd* ldElemDstOpnd = IR::RegOpnd::New(TyMachReg,func);
    const IR::AutoReuseOpnd autoReuseldElemDstOpnd(ldElemDstOpnd, func);
    IR::Instr* ldElem = IR::Instr::New(Js::OpCode::LdElemI_A, ldElemDstOpnd, nthArgument, func);
    callInstr->InsertBefore(ldElem);
    GenerateFastStackArgumentsLdElemI(ldElem);

    IR::Instr* argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
    argout->SetSrc1(ldElemDstOpnd);
    argout->SetSrc2(ldLenDstOpnd);
    callInstr->InsertBefore(argout);
    this->m_lowererMD.LoadDynamicArgumentUsingLength(argout);

    IR::BranchInstr *tailBranch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, startLoop, func);
    callInstr->InsertBefore(tailBranch);

    callInstr->InsertBefore(endLoop);

    loop->regAlloc.liveOnBackEdgeSyms->Set(ldLenDstOpnd->m_sym->m_id);

    // Note: This loop iteratively adds instructions in two locations; in the block
    // of branches that jump to the "load elements to argOuts" instructions, and in
    // the the block of load elements to argOuts instructions themselves.

    // 4 to denote this is 4th register after this, callinfo & function object
    // INT_ARG_REG_COUNT is the number of parameters passed in int regs
    uint current_reg_pass = INT_ARG_REG_COUNT - 4;

    do
    {
        // If we're on this pass we know we have to do at least one of these, so skip
        // the branch if we're on the last one.
        if (current_reg_pass != INT_ARG_REG_COUNT - 4)
        {
            IR::LabelInstr* loadBlockLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            IR::Instr* branchToBlock = IR::BranchInstr::New(Js::OpCode::BrEq_I4, loadBlockLabel, ldLenDstOpnd, IR::IntConstOpnd::New(current_reg_pass + 1, TyInt8, func), func);
            endLoop->InsertAfter(branchToBlock);
            callInstr->InsertBefore(loadBlockLabel);
        }

        // TODO: We can further optimize this with a GenerateFastStackArgumentsLdElemI that can
        // handle us passing along constant argument references and encode them into the offset
        // instead of having to use an IndirOpnd; this would allow us to save a few bytes here,
        // and reduce register pressure a hair

        // stemp.var = LdImm current_reg_pass
        IR::RegOpnd* localTemp = IR::RegOpnd::New(TyInt32, func);
        // We need to make it a tagged int because GenerateFastStackArgumentsLdElemI asserts if
        // it is not.
        localTemp->SetValueType(ValueType::GetTaggedInt());
        const IR::AutoReuseOpnd autoReuseldElemDstOpnd3(localTemp, func);
        this->InsertMove(localTemp, IR::IntConstOpnd::New(current_reg_pass, TyInt8, func, true), callInstr);

        // sTemp = LdElem_I   [s4.var + current_reg_pass (aka stemp.var) ]
        nthArgument = IR::IndirOpnd::New(stackArgs, localTemp, TyMachReg, func);
        ldElemDstOpnd = IR::RegOpnd::New(TyMachReg, func);
        const IR::AutoReuseOpnd autoReuseldElemDstOpnd2(ldElemDstOpnd, func);
        ldElem = IR::Instr::New(Js::OpCode::LdElemI_A, ldElemDstOpnd, nthArgument, func);
        callInstr->InsertBefore(ldElem);
        GenerateFastStackArgumentsLdElemI(ldElem);

        argout = IR::Instr::New(Js::OpCode::ArgOut_A_Dynamic, func);
        argout->SetSrc1(ldElemDstOpnd);
        callInstr->InsertBefore(argout);
        this->m_lowererMD.LoadDynamicArgument(argout, current_reg_pass + 4);
    }
    while (current_reg_pass-- != 0);

    callInstr->InsertBefore(doneArgs);

    /*return the length which will be used for callInfo generations & stack allocation*/
    return saveLenInstr->GetDst()->AsRegOpnd();
#endif
}